

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

void interpolative_internal::encode_interpolative
               (bit_stream *os,uint32_t *in_buf,size_t n,size_t low,size_t high)

{
  ulong u;
  bit_stream *in_RCX;
  uint32_t *in_RDX;
  bit_stream *in_RSI;
  uint64_t in_R8;
  uint64_t v;
  uint64_t n2;
  uint64_t n1;
  uint64_t h;
  
  if (in_RDX != (uint32_t *)0x0) {
    u = (long)in_RDX + 1U >> 1;
    write_center_mid(in_RCX,in_R8,u);
    encode_interpolative(in_RSI,in_RDX,(size_t)in_RCX,in_R8,u);
    encode_interpolative(in_RSI,in_RDX,(size_t)in_RCX,in_R8,u);
  }
  return;
}

Assistant:

static inline void encode_interpolative(bit_stream& os,
        const uint32_t* in_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = in_buf[h - 1ULL] + 1ULL; // we don't encode 0

        write_center_mid(os, v - low - n1 + 1ULL, high - n2 - low - n1 + 1ULL);

        encode_interpolative(os, in_buf, n1, low, v - 1ULL);
        encode_interpolative(os, in_buf + h, n2, v + 1ULL, high);
    }